

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<SignedInt>::TestInfo::TestInfo
          (TestInfo *this,char *a_test_suite_base_name,char *a_test_base_name,
          TestMetaFactoryBase<int> *a_test_meta_factory,CodeLocation *a_code_location)

{
  TestMetaFactoryBase<int> *pTVar1;
  allocator local_45 [20];
  allocator local_31;
  CodeLocation *local_30;
  CodeLocation *a_code_location_local;
  TestMetaFactoryBase<int> *a_test_meta_factory_local;
  char *a_test_base_name_local;
  char *a_test_suite_base_name_local;
  TestInfo *this_local;
  
  local_30 = a_code_location;
  a_code_location_local = (CodeLocation *)a_test_meta_factory;
  a_test_meta_factory_local = (TestMetaFactoryBase<int> *)a_test_base_name;
  a_test_base_name_local = a_test_suite_base_name;
  a_test_suite_base_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,a_test_suite_base_name,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pTVar1 = a_test_meta_factory_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->test_base_name,(char *)pTVar1,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  std::
  unique_ptr<testing::internal::TestMetaFactoryBase<int>,std::default_delete<testing::internal::TestMetaFactoryBase<int>>>
  ::unique_ptr<std::default_delete<testing::internal::TestMetaFactoryBase<int>>,void>
            ((unique_ptr<testing::internal::TestMetaFactoryBase<int>,std::default_delete<testing::internal::TestMetaFactoryBase<int>>>
              *)&this->test_meta_factory,(pointer)a_code_location_local);
  CodeLocation::CodeLocation(&this->code_location,a_code_location);
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}